

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool fileExists(string *filename)

{
  int iVar1;
  char *pcVar2;
  string *in_RDI;
  string ftrimmed;
  string rtrimmed;
  string delims;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = access(pcVar2,0);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30," \f\n\r\t\v",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::__cxx11::string::find_last_not_of(local_10,(ulong)local_30);
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    std::__cxx11::string::find_first_not_of(local_68,(ulong)local_30);
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_68);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = access(pcVar2,0);
    local_1 = iVar1 != -1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_30);
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool fileExists(const std::string& filename)
{
    if (access( filename.c_str(), F_OK ) != -1)
    {
        return true; // file exists
    }
    else
    {
        //std::cout << "access(filename) returned -1 on filename [" << filename << "] I will try trimming." << std::endl;
        std::string delims = " \f\n\r\t\v";
        std::string rtrimmed = filename.substr(0, filename.find_last_not_of(delims) + 1);
        std::string ftrimmed = rtrimmed.substr(rtrimmed.find_first_not_of(delims));
        if (access( ftrimmed.c_str(), F_OK ) != -1)
        {
            return true;
        }
        else
        {
            //std::cout << "Still failed. Cannot find the specified file." << std::endl;
            return false;// file doesn't exist
        }
    }
}